

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O0

bool __thiscall QSqlDatabase::moveToThread(QSqlDatabase *this,QThread *targetThread)

{
  byte bVar1;
  int iVar2;
  QSqlDriver *pQVar3;
  QSqlDatabasePrivate *pQVar4;
  undefined8 uVar5;
  undefined8 in_RSI;
  QSqlDatabase *in_RDI;
  long in_FS_OFFSET;
  QSqlDriver *drv;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QSqlDriver *pQVar6;
  QMessageLogger *in_stack_ffffffffffffffb0;
  bool local_29;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = driver(in_RDI);
  if ((pQVar3 == (QSqlDriver *)0x0) ||
     (pQVar6 = pQVar3, pQVar4 = QSqlDatabasePrivate::shared_null(), pQVar6 == pQVar4->driver)) {
    local_29 = false;
  }
  else {
    iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x11eb3a);
    if (iVar2 < 3) {
      bVar1 = QObject::moveToThread(pQVar3,in_RSI);
      local_29 = (bool)(bVar1 & 1);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffb0,(char *)in_RDI,(int)((ulong)pQVar6 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      QtPrivate::asString(&in_RDI->d->connName);
      uVar5 = QString::utf16();
      QMessageLogger::warning
                (local_28,
                 "QSqlDatabasePrivate::moveToThread: connection \'%ls\' is still in use in the current thread."
                 ,uVar5);
      local_29 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QSqlDatabase::moveToThread(QThread *targetThread)
{
    if (auto drv = driver()) {
        if (drv != QSqlDatabasePrivate::shared_null()->driver) {
            // two instances are alive - the one here and the one in dbDict()
            if (d->ref.loadRelaxed() > 2) {
                qWarning("QSqlDatabasePrivate::moveToThread: connection '%ls' is still in use "
                         "in the current thread.", qUtf16Printable(d->connName));
                return false;
            }
            return drv->moveToThread(targetThread);
        }
    }
    return false;
}